

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O1

void SHA224_256Finalize(SHA256Context *context,uint8_t Pad_Byte)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  long lVar4;
  
  lVar4 = (long)context->Message_Block_Index;
  sVar3 = context->Message_Block_Index + 1;
  context->Message_Block_Index = sVar3;
  if (lVar4 < 0x38) {
    context->Message_Block[lVar4] = Pad_Byte;
  }
  else {
    context->Message_Block[lVar4] = Pad_Byte;
    while (sVar3 < 0x40) {
      context->Message_Block_Index = sVar3 + 1;
      context->Message_Block[sVar3] = '\0';
      sVar3 = context->Message_Block_Index;
    }
    SHA224_256ProcessMessageBlock(context);
  }
  sVar3 = context->Message_Block_Index;
  while (sVar3 < 0x38) {
    context->Message_Block_Index = sVar3 + 1;
    context->Message_Block[sVar3] = '\0';
    sVar3 = context->Message_Block_Index;
  }
  uVar1 = context->Length_Low;
  uVar2 = context->Length_High;
  *(uint *)(context->Message_Block + 0x38) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  *(uint *)(context->Message_Block + 0x3c) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  SHA224_256ProcessMessageBlock(context);
  context->Message_Block[0x30] = '\0';
  context->Message_Block[0x31] = '\0';
  context->Message_Block[0x32] = '\0';
  context->Message_Block[0x33] = '\0';
  context->Message_Block[0x34] = '\0';
  context->Message_Block[0x35] = '\0';
  context->Message_Block[0x36] = '\0';
  context->Message_Block[0x37] = '\0';
  context->Message_Block[0x38] = '\0';
  context->Message_Block[0x39] = '\0';
  context->Message_Block[0x3a] = '\0';
  context->Message_Block[0x3b] = '\0';
  context->Message_Block[0x3c] = '\0';
  context->Message_Block[0x3d] = '\0';
  context->Message_Block[0x3e] = '\0';
  context->Message_Block[0x3f] = '\0';
  context->Message_Block[0x20] = '\0';
  context->Message_Block[0x21] = '\0';
  context->Message_Block[0x22] = '\0';
  context->Message_Block[0x23] = '\0';
  context->Message_Block[0x24] = '\0';
  context->Message_Block[0x25] = '\0';
  context->Message_Block[0x26] = '\0';
  context->Message_Block[0x27] = '\0';
  context->Message_Block[0x28] = '\0';
  context->Message_Block[0x29] = '\0';
  context->Message_Block[0x2a] = '\0';
  context->Message_Block[0x2b] = '\0';
  context->Message_Block[0x2c] = '\0';
  context->Message_Block[0x2d] = '\0';
  context->Message_Block[0x2e] = '\0';
  context->Message_Block[0x2f] = '\0';
  context->Message_Block[0x10] = '\0';
  context->Message_Block[0x11] = '\0';
  context->Message_Block[0x12] = '\0';
  context->Message_Block[0x13] = '\0';
  context->Message_Block[0x14] = '\0';
  context->Message_Block[0x15] = '\0';
  context->Message_Block[0x16] = '\0';
  context->Message_Block[0x17] = '\0';
  context->Message_Block[0x18] = '\0';
  context->Message_Block[0x19] = '\0';
  context->Message_Block[0x1a] = '\0';
  context->Message_Block[0x1b] = '\0';
  context->Message_Block[0x1c] = '\0';
  context->Message_Block[0x1d] = '\0';
  context->Message_Block[0x1e] = '\0';
  context->Message_Block[0x1f] = '\0';
  context->Message_Block[0] = '\0';
  context->Message_Block[1] = '\0';
  context->Message_Block[2] = '\0';
  context->Message_Block[3] = '\0';
  context->Message_Block[4] = '\0';
  context->Message_Block[5] = '\0';
  context->Message_Block[6] = '\0';
  context->Message_Block[7] = '\0';
  context->Message_Block[8] = '\0';
  context->Message_Block[9] = '\0';
  context->Message_Block[10] = '\0';
  context->Message_Block[0xb] = '\0';
  context->Message_Block[0xc] = '\0';
  context->Message_Block[0xd] = '\0';
  context->Message_Block[0xe] = '\0';
  context->Message_Block[0xf] = '\0';
  context->Length_Low = 0;
  context->Length_High = 0;
  context->Computed = 1;
  return;
}

Assistant:

static void SHA224_256Finalize(SHA256Context *context, uint8_t Pad_Byte)
{
    int i;
    SHA224_256PadMessage(context, Pad_Byte);
    /* message may be sensitive, so clear it out */
    for (i = 0; i < SHA256_Message_Block_Size; ++i)
    {
        context->Message_Block[i] = 0;
    }
    context->Length_Low = 0;  /* and clear length */
    context->Length_High = 0;
    context->Computed = 1;
}